

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoPoint>_> *this,void **vtt)

{
  void *pvVar1;
  double local_20;
  
  TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoPoint>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoPoint>).
             super_TPZGeoElRefLess<pzgeom::TPZGeoPoint>.super_TPZGeoEl = pvVar1;
  *(void **)(&(((TPZGeoElRefLess<pzgeom::TPZGeoPoint> *)
               (&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoPoint>).
                 super_TPZGeoElRefLess<pzgeom::TPZGeoPoint>.fGeo + -4))->super_TPZGeoEl).field_0x0 +
            *(long *)((long)pvVar1 + -0x60)) = vtt[7];
  local_20 = 0.0;
  TPZFNMatrix<0,_double>::TPZFNMatrix(&this->fCornerCo,0,1,&local_20);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}